

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiGranularityTests.cpp
# Opt level: O0

void __thiscall
vkt::api::anon_unknown_0::GranularityInstance::checkFormatSupport
          (GranularityInstance *this,VkFormat format)

{
  int iVar1;
  InstanceInterface *pIVar2;
  VkPhysicalDevice pVVar3;
  NotSupportedError *this_00;
  undefined1 local_38 [4];
  VkResult result;
  VkImageFormatProperties properties;
  VkFormat format_local;
  GranularityInstance *this_local;
  
  properties.maxResourceSize._4_4_ = format;
  pIVar2 = Context::getInstanceInterface((this->super_TestInstance).m_context);
  pVVar3 = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  iVar1 = (*pIVar2->_vptr_InstanceInterface[4])
                    (pIVar2,pVVar3,(ulong)properties.maxResourceSize._4_4_,1,0,4,0,local_38);
  if (iVar1 == -0xb) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Format not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiGranularityTests.cpp"
               ,0x84);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  return;
}

Assistant:

void GranularityInstance::checkFormatSupport (const VkFormat format)
{
	VkImageFormatProperties	properties;

	VkResult result = m_context.getInstanceInterface().getPhysicalDeviceImageFormatProperties(m_context.getPhysicalDevice(),
																							  format, VK_IMAGE_TYPE_2D,
																							  VK_IMAGE_TILING_OPTIMAL,
																							  VK_IMAGE_USAGE_SAMPLED_BIT,
																							  0,
																							  &properties);

	if (result == VK_ERROR_FORMAT_NOT_SUPPORTED)
		TCU_THROW(NotSupportedError, "Format not supported");
}